

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Field> *
wasm::WATParser::storagetype<wasm::WATParser::ParseTypeDefsCtx>
          (Result<wasm::Field> *__return_storage_ptr__,ParseTypeDefsCtx *ctx)

{
  __index_type *__return_storage_ptr___00;
  ParseTypeDefsCtx *this;
  bool bVar1;
  Lexer *this_00;
  Type *pTVar2;
  basic_string_view<char,_std::char_traits<char>_> expected;
  StorageT local_f8;
  uint local_e4;
  Err local_e0;
  Err *local_c0;
  Err *err;
  undefined1 local_a8 [8];
  Result<wasm::Type> _val;
  Result<wasm::Type> type;
  StorageT local_38;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  ParseTypeDefsCtx *local_18;
  ParseTypeDefsCtx *ctx_local;
  
  local_18 = ctx;
  ctx_local = (ParseTypeDefsCtx *)__return_storage_ptr__;
  local_28 = sv("i8",2);
  bVar1 = Lexer::takeKeyword(&ctx->in,local_28);
  if (bVar1) {
    local_38 = TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::makeI8
                         (&local_18->super_TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>);
    Result<wasm::Field>::Result<wasm::Field>(__return_storage_ptr__,&local_38);
  }
  else {
    this_00 = &local_18->in;
    expected = sv("i16",3);
    bVar1 = Lexer::takeKeyword(this_00,expected);
    if (bVar1) {
      join_0x00000010_0x00000000_ =
           TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::makeI16
                     (&local_18->super_TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>);
      Result<wasm::Field>::Result<wasm::Field>
                (__return_storage_ptr__,
                 (Field *)((long)&type.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
    }
    else {
      __return_storage_ptr___00 =
           (__index_type *)
           ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                   super__Move_assign_alias<wasm::Type,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20);
      valtype<wasm::WATParser::ParseTypeDefsCtx>
                ((Result<wasm::Type> *)__return_storage_ptr___00,local_18);
      Result<wasm::Type>::Result
                ((Result<wasm::Type> *)local_a8,(Result<wasm::Type> *)__return_storage_ptr___00);
      local_c0 = Result<wasm::Type>::getErr((Result<wasm::Type> *)local_a8);
      bVar1 = local_c0 != (Err *)0x0;
      if (bVar1) {
        wasm::Err::Err(&local_e0,local_c0);
        Result<wasm::Field>::Result(__return_storage_ptr__,&local_e0);
        wasm::Err::~Err(&local_e0);
      }
      local_e4 = (uint)bVar1;
      Result<wasm::Type>::~Result((Result<wasm::Type> *)local_a8);
      this = local_18;
      if (local_e4 == 0) {
        pTVar2 = Result<wasm::Type>::operator*
                           ((Result<wasm::Type> *)
                            ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
        local_f8 = TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::makeStorageType
                             (&this->super_TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>,
                              (TypeT)pTVar2->id);
        Result<wasm::Field>::Result<wasm::Field>(__return_storage_ptr__,&local_f8);
        local_e4 = 1;
      }
      Result<wasm::Type>::~Result
                ((Result<wasm::Type> *)
                 ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::FieldT> storagetype(Ctx& ctx) {
  if (ctx.in.takeKeyword("i8"sv)) {
    return ctx.makeI8();
  }
  if (ctx.in.takeKeyword("i16"sv)) {
    return ctx.makeI16();
  }
  auto type = valtype(ctx);
  CHECK_ERR(type);
  return ctx.makeStorageType(*type);
}